

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

void __thiscall
google::
dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
::dense_hashtable(dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
                  *this,dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
                        *ht,size_type min_buckets_wanted)

{
  size_type sVar1;
  float fVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  undefined1 uVar6;
  uint uVar7;
  size_type sVar8;
  
  sVar8 = (ht->settings).super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
          enlarge_threshold_;
  sVar1 = (ht->settings).super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
          shrink_threshold_;
  fVar2 = (ht->settings).super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
          shrink_factor_;
  bVar3 = (ht->settings).super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
          consider_shrink_;
  bVar4 = (ht->settings).super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
          use_empty_;
  bVar5 = (ht->settings).super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
          use_deleted_;
  uVar6 = (ht->settings).super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
          field_0x1b;
  uVar7 = (ht->settings).super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
          num_ht_copies_;
  (this->settings).super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  enlarge_factor_ =
       (ht->settings).super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
       enlarge_factor_;
  (this->settings).super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  shrink_factor_ = fVar2;
  (this->settings).super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  consider_shrink_ = bVar3;
  (this->settings).super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  use_empty_ = bVar4;
  (this->settings).super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  use_deleted_ = bVar5;
  (this->settings).super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  field_0x1b = uVar6;
  (this->settings).super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  num_ht_copies_ = uVar7;
  (this->settings).super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  enlarge_threshold_ = sVar8;
  (this->settings).super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  shrink_threshold_ = sVar1;
  KeyInfo::KeyInfo(&this->key_info,&ht->key_info);
  this->table = (pointer)0x0;
  this->num_buckets = 0;
  this->num_deleted = 0;
  this->num_elements = 0;
  if ((ht->settings).super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
      use_empty_ != false) {
    sparsehash_internal::sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>::
    reset_thresholds((sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4> *)this,0);
    dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
    ::
    copy_or_move_from<google::dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>>
              ((dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                *)this,ht,min_buckets_wanted);
    return;
  }
  sVar8 = sparsehash_internal::sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>::
          min_buckets((sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4> *)this,
                      ht->num_elements - ht->num_deleted,min_buckets_wanted);
  this->num_buckets = sVar8;
  sparsehash_internal::sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>::
  reset_thresholds((sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4> *)this,sVar8
                  );
  return;
}

Assistant:

dense_hashtable(dense_hashtable&& ht,
                  size_type min_buckets_wanted)
      : settings(ht.settings),
        key_info(ht.key_info),
        num_deleted(0),
        num_elements(0),
        num_buckets(0),
        val_info(std::move(ht.val_info)),
        table(NULL) {
    if (!ht.settings.use_empty()) {
      // If use_empty isn't set, copy_or_move_from will crash, so we do our own copying.
      assert(ht.empty());
      num_buckets = settings.min_buckets(ht.size(), min_buckets_wanted);
      settings.reset_thresholds(bucket_count());
      return;
    }
    settings.reset_thresholds(bucket_count());
    copy_or_move_from(std::move(ht), min_buckets_wanted);  // copy_or_move_from() ignores deleted entries
  }